

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O1

void * __thiscall ON_Workspace::GrowMemory(ON_Workspace *this,void *p,size_t size)

{
  void *pvVar1;
  ON_Workspace_MBLK *pOVar2;
  
  if (p == (void *)0x0) {
    pvVar1 = GetMemory(this,size);
    return pvVar1;
  }
  pOVar2 = (ON_Workspace_MBLK *)&this->m_pMemBlk;
  do {
    pOVar2 = pOVar2->pNext;
    if (pOVar2 == (ON_Workspace_MBLK *)0x0) {
      return (void *)0x0;
    }
  } while (pOVar2->pMem != p);
  if (size != 0) {
    p = onrealloc(p,size);
  }
  pOVar2->pMem = p;
  return p;
}

Assistant:

void* ON_Workspace::GrowMemory( void* p, size_t size )
{
  void* newp = nullptr;
  if ( !p ) {
    newp = GetMemory(size);
  }
  else {
    struct ON_Workspace_MBLK* pBlk = m_pMemBlk;
    while ( pBlk ) {
      if ( pBlk->pMem == p ) {
        if ( size > 0 ) {
          newp = onrealloc(p,size);
        }
        else {
          newp = p;
        }
        pBlk->pMem = newp;
        break;
      }
      pBlk = pBlk->pNext;
    }
  }
  return newp;
}